

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O1

vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *
FastPForLib::generateArray
          (vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
           *__return_storage_ptr__,uint32_t N,uint32_t mask)

{
  uint uVar1;
  ulong uVar2;
  allocator_type local_29;
  
  std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::vector
            (__return_storage_ptr__,(ulong)N,&local_29);
  if (N != 0) {
    uVar2 = 0;
    do {
      uVar1 = rand();
      (__return_storage_ptr__->
      super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>).
      _M_impl.super__Vector_impl_data._M_start[uVar2] = uVar1 & mask;
      uVar2 = uVar2 + 1;
    } while (N != uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t, cacheallocator>
generateArray(uint32_t N, const uint32_t mask = 0xFFFFFFFFU) {
  std::vector<uint32_t, cacheallocator> ans(N);
  for (size_t k = 0; k < N; ++k)
    ans[k] = rand() & mask;
  return ans;
}